

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts
          (DeepScanLineInputFile *this,int scanline1,int scanline2)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  IStream *pIVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  ArgExc *pAVar5;
  Array2D<unsigned_int> *sampleCountBuffer;
  long lVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  stringstream _iex_replace_s;
  
  if (this->_data->frameBufferValid == false) {
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar5,"readPixelSampleCounts called with no valid frame buffer");
    __cxa_throw(pAVar5,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  std::mutex::lock((mutex *)&__mutex->__data);
  iVar3 = (*this->_data->_streamData->is->_vptr_IStream[5])();
  iVar4 = scanline2;
  iVar9 = scanline1;
  if (scanline2 < scanline1) {
    iVar4 = scanline1;
    iVar9 = scanline2;
  }
  if ((iVar9 < this->_data->minY) || (this->_data->maxY < iVar4)) {
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc
              (pAVar5,"Tried to read scan line sample counts outside the image file\'s data window."
              );
    __cxa_throw(pAVar5,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  if (scanline2 < scanline1) {
    scanline1 = scanline2;
  }
  lVar10 = (long)scanline1;
  do {
    pDVar1 = this->_data;
    if (iVar4 < lVar10) {
      pIVar2 = pDVar1->_streamData->is;
      (*pIVar2->_vptr_IStream[6])(pIVar2,CONCAT44(extraout_var,iVar3));
      pthread_mutex_unlock(__mutex);
      return;
    }
    if (pDVar1->bigFile == true) {
      iVar9 = pDVar1->minY;
LAB_00164cd9:
      iVar8 = ((int)lVar10 - iVar9) / pDVar1->linesInBuffer;
      sampleCountBuffer = &pDVar1->sampleCount;
      if (pDVar1->bigFile != false) {
        sampleCountBuffer = (Array2D<unsigned_int> *)0x0;
      }
      anon_unknown_0::readSampleCountForLineBlock
                (pDVar1->_streamData,pDVar1,iVar8,sampleCountBuffer,iVar9,true);
      pDVar1 = this->_data;
      iVar8 = iVar8 * pDVar1->linesInBuffer + pDVar1->minY;
      iVar9 = pDVar1->linesInBuffer + iVar8 + -1;
      if (pDVar1->maxY < iVar9) {
        iVar9 = pDVar1->maxY;
      }
      bytesPerDeepLineTable
                (&pDVar1->header,iVar8,iVar9,pDVar1->sampleCountSliceBase,pDVar1->sampleCountXStride
                 ,pDVar1->sampleCountYStride,&pDVar1->bytesPerLine);
      pDVar1 = this->_data;
      offsetInLineBufferTable
                (&pDVar1->bytesPerLine,iVar8 - pDVar1->minY,iVar9 - pDVar1->minY,
                 pDVar1->linesInBuffer,&pDVar1->offsetInLineBuffer);
    }
    else {
      iVar9 = pDVar1->minY;
      if ((pDVar1->gotSampleCount)._data[lVar10 - iVar9] != true) goto LAB_00164cd9;
      iVar8 = pDVar1->sampleCountXStride;
      lVar6 = (long)pDVar1->minX;
      pcVar7 = pDVar1->sampleCountSliceBase + lVar6 * iVar8 + pDVar1->sampleCountYStride * lVar10;
      for (; lVar6 <= pDVar1->maxX; lVar6 = lVar6 + 1) {
        *(undefined4 *)pcVar7 =
             *(undefined4 *)
              ((long)(pDVar1->sampleCount)._data +
              lVar6 * 4 +
              (pDVar1->sampleCount)._sizeY * (lVar10 - iVar9) * 4 + (long)pDVar1->minX * -4);
        pcVar7 = pcVar7 + iVar8;
      }
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

void
DeepScanLineInputFile::readPixelSampleCounts (int scanline1, int scanline2)
{
    uint64_t savedFilePos = 0;

    if (!_data->frameBufferValid)
    {
        throw IEX_NAMESPACE::ArgExc (
            "readPixelSampleCounts called with no valid frame buffer");
    }

    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
        savedFilePos = _data->_streamData->is->tellg ();

        int scanLineMin = min (scanline1, scanline2);
        int scanLineMax = max (scanline1, scanline2);

        if (scanLineMin < _data->minY || scanLineMax > _data->maxY)
            throw IEX_NAMESPACE::ArgExc (
                "Tried to read scan line sample counts outside "
                "the image file's data window.");

        for (int i = scanLineMin; i <= scanLineMax; i++)
        {
            //
            // if scanline is already read, and file is small enough to cache, count data will be in the cache
            // otherwise, read from file, store in cache and in caller's framebuffer
            //
            if (!_data->bigFile && _data->gotSampleCount[i - _data->minY])
            {
                fillSampleCountFromCache (i, _data);
            }
            else
            {

                int lineBlockId = (i - _data->minY) / _data->linesInBuffer;

                //
                // read samplecount data into external buffer
                // also cache to internal buffer unless in bigFile mode
                //
                readSampleCountForLineBlock (
                    _data->_streamData,
                    _data,
                    lineBlockId,
                    _data->bigFile ? nullptr : &_data->sampleCount,
                    _data->minY,
                    true);

                int minYInLineBuffer =
                    lineBlockId * _data->linesInBuffer + _data->minY;
                int maxYInLineBuffer = min (
                    minYInLineBuffer + _data->linesInBuffer - 1, _data->maxY);

                //
                // For each line within the block, get the count of bytes.
                //

                bytesPerDeepLineTable (
                    _data->header,
                    minYInLineBuffer,
                    maxYInLineBuffer,
                    _data->sampleCountSliceBase,
                    _data->sampleCountXStride,
                    _data->sampleCountYStride,
                    _data->bytesPerLine);

                //
                // For each scanline within the block, get the offset.
                //

                offsetInLineBufferTable (
                    _data->bytesPerLine,
                    minYInLineBuffer - _data->minY,
                    maxYInLineBuffer - _data->minY,
                    _data->linesInBuffer,
                    _data->offsetInLineBuffer);
            }
        }

        _data->_streamData->is->seekg (savedFilePos);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error reading sample count data from image "
            "file \""
                << fileName () << "\". " << e.what ());

        _data->_streamData->is->seekg (savedFilePos);

        throw;
    }
}